

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O2

size_t leb128_len(uchar *p)

{
  size_t ret;
  size_t sVar1;
  
  for (sVar1 = 1; (char)p[sVar1 - 1] < '\0'; sVar1 = sVar1 + 1) {
  }
  return sVar1;
}

Assistant:

static size_t
leb128_len (const unsigned char *p)
{
  size_t ret;

  ret = 1;
  while ((*p & 0x80) != 0)
    {
      ++p;
      ++ret;
    }
  return ret;
}